

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s-hierarchy-decoder-CH.cc
# Opt level: O1

Expression __thiscall
RNNLanguageModel<cnn::FastLSTMBuilder>::BuildTaggingGraph
          (RNNLanguageModel<cnn::FastLSTMBuilder> *this,vector<int,_std::allocator<int>_> *sent,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *chars,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *labels,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *results,ComputationGraph *cg,double *cor,uint *predict,uint *overall,bool train)

{
  pointer *ppiVar1;
  vector<int,std::allocator<int>> *this_00;
  pointer pvVar2;
  pointer pvVar3;
  pointer pEVar4;
  ComputationGraph *pCVar5;
  iterator __position;
  undefined1 auVar6 [16];
  int *piVar7;
  RNNBuilder *this_01;
  Expression *x;
  RNNLanguageModel<cnn::FastLSTMBuilder> *pRVar8;
  pointer pvVar9;
  Tensor *pTVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar15;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar16;
  ulong uVar17;
  pointer pVVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  pointer pVVar22;
  ulong uVar23;
  bool bVar24;
  double dVar25;
  undefined1 auVar26 [64];
  undefined1 extraout_var [56];
  undefined1 auVar27 [64];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 auVar28 [16];
  undefined8 in_XMM2_Qb;
  Expression EVar29;
  undefined7 in_stack_00000021;
  char in_stack_00000028;
  Expression oh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> alpha_i;
  int bestk;
  Expression i_charpadding1;
  Expression i_charpadding_1;
  Expression i_wordpadding1;
  Expression i_wordpadding_1;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_char;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_inputw;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charw;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_input;
  Expression i_l;
  Expression input_cols;
  Expression i_charpadding2;
  Expression i_charpadding_2;
  Expression i_wordpadding2;
  Expression i_wordpadding_2;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_oh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> errs;
  Expression i_lh;
  Expression i_lhbias;
  Expression i_oh2lh;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charxExp;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_word;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charPool;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> revs;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> fwds;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_charinput;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_charSum;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charxMExp;
  Expression i_lh2l;
  Expression i_u;
  Expression oh2ohxMExp;
  Expression i_oh2ohxMExp;
  Expression i_xMExpbias;
  Expression i_word2xMExp;
  Expression i_charh2xMExp;
  Expression i_charhbias;
  Expression i_charw2charh;
  Expression i_xMExp2xExp;
  Expression combine_h;
  Expression alpha;
  undefined1 local_428 [8];
  pointer pEStack_420;
  ComputationGraph *local_418;
  uint local_410;
  uint uStack_40c;
  uint local_408;
  undefined4 uStack_404;
  uint local_400;
  ComputationGraph *local_3f8;
  uint local_3f0;
  ComputationGraph *local_3e8;
  uint local_3e0;
  undefined1 local_3d8 [8];
  size_type local_3d0;
  undefined1 local_3c8 [24];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_3b0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_3a8;
  int local_39c;
  undefined8 local_398;
  RNNBuilder *local_390;
  ulong local_388;
  undefined1 local_380 [24];
  uint local_368;
  undefined1 local_360 [24];
  uint local_348;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_340;
  pointer local_338;
  ExecutionEngine *local_330;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_328;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_310;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_2f8;
  initializer_list<cnn::expr::Expression> local_2e0;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_2d0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_2b8;
  Expression local_2b0;
  initializer_list<cnn::expr::Expression> local_2a0;
  undefined1 local_290 [32];
  undefined1 local_270 [24];
  undefined4 local_258;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_250;
  ComputationGraph *local_238;
  ulong local_230;
  undefined1 local_228 [16];
  pointer local_218;
  initializer_list<cnn::expr::Expression> local_208;
  undefined1 local_1f8 [24];
  uint local_1e0;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_1d8;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_1c0;
  Expression *local_1a8;
  RNNLanguageModel<cnn::FastLSTMBuilder> *local_1a0;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_198;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_180;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_168;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_150;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_138;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_120;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_108;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [24];
  undefined4 local_a8;
  undefined1 local_a0 [24];
  uint local_88;
  undefined1 local_80 [24];
  uint local_68;
  Expression local_60;
  Expression local_50;
  Expression local_40;
  
  pvVar2 = (chars->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = (chars->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppiVar1 = &sent[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  if (((ulong)sent[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage & 0xfffffffd00000000) == 0) {
    *(undefined4 *)
     ((long)&sent[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + 4) = 1;
  }
  local_3b0 = labels;
  local_390 = (RNNBuilder *)ppiVar1;
  local_340 = results;
  local_2b8 = chars;
  local_238 = cg;
  (**(code **)(*ppiVar1 + 0x12))(ppiVar1,cor);
  _local_428 = (Expression)ZEXT816(0);
  local_418 = (ComputationGraph *)0x0;
  cnn::RNNBuilder::start_new_sequence
            ((RNNBuilder *)ppiVar1,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_428);
  if (local_428 != (undefined1  [8])0x0) {
    operator_delete((void *)local_428);
  }
  ppiVar1 = &sent[0xf].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  if (((ulong)sent[0x10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start & 0xfffffffd00000000) == 0) {
    *(undefined4 *)
     ((long)&sent[0x10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + 4) = 1;
  }
  (**(code **)(*ppiVar1 + 0x12))(ppiVar1,cor);
  _local_428 = (Expression)ZEXT816(0);
  local_418 = (ComputationGraph *)0x0;
  cnn::RNNBuilder::start_new_sequence
            ((RNNBuilder *)ppiVar1,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_428);
  pVVar22 = (pointer)((long)pvVar2 - (long)pvVar3 >> 2);
  local_1a8 = (Expression *)ppiVar1;
  if (local_428 != (undefined1  [8])0x0) {
    operator_delete((void *)local_428);
  }
  uVar17 = (ulong)pVVar22 & 0xffffffff;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_238,uVar17);
  cnn::expr::parameter((ComputationGraph *)(local_270 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_360 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_270,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_360,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_290 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_380 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_290,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_380,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_80 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_80,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_a0 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_a0,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_c0 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&local_60,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_c0,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_d0,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_e0,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_1f8 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_1f8,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_f0,(Parameters *)cor);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_1c0,uVar17,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_328,uVar17,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_2f8,uVar17,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_180,uVar17,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_108,uVar17,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_1d8,uVar17,(allocator_type *)local_428);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_120,uVar17,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_198,uVar17,(allocator_type *)local_428);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_138,uVar17,(allocator_type *)local_428);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_2d0,uVar17,(allocator_type *)local_428);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_310,uVar17,(allocator_type *)local_428);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_150,uVar17,(allocator_type *)local_428);
  local_1a0 = this;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_168,uVar17,(allocator_type *)local_428);
  local_330 = (ExecutionEngine *)sent;
  local_230 = uVar17;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_250,uVar17,(allocator_type *)local_428);
  local_228 = ZEXT816(0) << 0x40;
  auVar26 = ZEXT1664(local_228);
  local_218 = (pointer)0x0;
  if ((int)pVVar22 != 0) {
    local_398 = (ulong)pVVar22 & 0xffffffff;
    uVar17 = 0;
    local_338 = pVVar22;
    do {
      cnn::expr::lookup((ComputationGraph *)local_428,(LookupParameters *)cor,
                        (uint)(((_Vector_base<int,_std::allocator<int>_> *)
                               &local_330->_vptr_ExecutionEngine)->_M_impl).super__Vector_impl_data.
                              _M_start);
      local_1c0.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar17].pg = (ComputationGraph *)local_428;
      local_1c0.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar17].i.t = pEStack_420._0_4_;
      if (eval == false) {
        auVar26 = ZEXT464((uint)pdrop);
        cnn::expr::dropout((expr *)local_428,
                           local_1c0.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar17,pdrop);
        local_1c0.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar17].pg = (ComputationGraph *)local_428;
        local_1c0.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar17].i.t = pEStack_420._0_4_;
      }
      pvVar2 = (local_3b0->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_388 = uVar17;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_328.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar17,
                 (long)pvVar2[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 *(long *)&pvVar2[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data >> 2);
      uVar23 = local_388;
      pvVar2 = (local_3b0->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pvVar2[local_388].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          pvVar2[local_388].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar11 = 1;
        uVar21 = 0;
        do {
          uVar19 = uVar11;
          cnn::expr::lookup((ComputationGraph *)local_428,(LookupParameters *)cor,
                            (uint)local_330->cg);
          pEVar4 = local_328.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar23].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pEVar4[uVar21].pg = (ComputationGraph *)local_428;
          pEVar4[uVar21].i.t = pEStack_420._0_4_;
          if (eval == false) {
            auVar26 = ZEXT464((uint)pdrop);
            cnn::expr::dropout((expr *)local_428,
                               local_328.
                               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar23].
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar21,pdrop);
            pEVar4 = local_328.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar23].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pEVar4[uVar21].pg = (ComputationGraph *)local_428;
            pEVar4[uVar21].i.t = pEStack_420._0_4_;
          }
          pvVar2 = (local_3b0->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar23;
          uVar11 = (ulong)((int)uVar19 + 1);
          uVar21 = uVar19;
        } while (uVar19 < (ulong)((long)(pvVar2->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  *(long *)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>).
                                            _M_impl.super__Vector_impl_data >> 2));
      }
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_2f8.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar17,
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_180.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar17,
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_108.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar17,
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_1d8.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar17,
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      lVar13 = (long)local_328.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar23].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_328.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar23].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pvVar15 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)(uVar17 * 0x10);
      if (lVar13 != 0) {
        pvVar9 = local_328.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar23;
        uVar11 = lVar13 >> 4;
        lVar20 = 0;
        uVar21 = 0;
        local_3a8 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)(uVar17 * 0x10);
        do {
          dVar25 = auVar26._0_8_;
          if (lVar20 == 0) {
            if (uVar11 < 2) {
              local_418 = (ComputationGraph *)local_380._16_8_;
              local_410 = local_368;
              pEVar4 = (pvVar9->
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pCVar5 = pEVar4->pg;
              local_408 = (uint)pCVar5;
              uStack_404 = (undefined4)((ulong)pCVar5 >> 0x20);
              local_400 = (pEVar4->i).t;
              local_3f8 = (ComputationGraph *)local_380._0_8_;
              local_3f0 = local_380._8_4_;
              local_3e8 = (ComputationGraph *)local_290._0_8_;
              local_3e0 = local_290._8_4_;
              local_3d0 = 5;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            else if (lVar13 == 0x20) {
              local_418 = (ComputationGraph *)local_380._16_8_;
              local_410 = local_368;
              pEVar4 = (pvVar9->
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_408 = (uint)pEVar4->pg;
              uStack_404 = (undefined4)((ulong)pEVar4->pg >> 0x20);
              local_400 = (pEVar4->i).t;
              local_3f8 = pEVar4[1].pg;
              local_3f0 = pEVar4[1].i.t;
              local_3e8 = (ComputationGraph *)local_380._0_8_;
              local_3e0 = local_380._8_4_;
              local_3d0 = 5;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            else {
              local_418 = (ComputationGraph *)local_380._16_8_;
              local_410 = local_368;
              pEVar4 = (pvVar9->
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_408 = (uint)pEVar4->pg;
              uStack_404 = (undefined4)((ulong)pEVar4->pg >> 0x20);
              local_400 = (pEVar4->i).t;
              local_3f8 = pEVar4[1].pg;
              local_3f0 = pEVar4[1].i.t;
              local_3e8 = pEVar4[2].pg;
              local_3e0 = pEVar4[2].i.t;
              local_3d0 = 5;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
          }
          else if (lVar20 == 0x10) {
            if (uVar21 + 1 < uVar11) {
              if (uVar11 < 4) {
                pEVar4 = (pvVar9->
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_418 = pEVar4->pg;
                local_410 = (pEVar4->i).t;
                local_408 = (uint)pEVar4[1].pg;
                uStack_404 = (undefined4)((ulong)pEVar4[1].pg >> 0x20);
                local_400 = pEVar4[1].i.t;
                local_3f8 = pEVar4[2].pg;
                local_3f0 = pEVar4[2].i.t;
                local_3e8 = (ComputationGraph *)local_380._0_8_;
                local_3e0 = local_380._8_4_;
                local_3d0 = 5;
                local_3d8 = (undefined1  [8])local_428;
                cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                          ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8)
                ;
              }
              else {
                pEVar4 = (pvVar9->
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_418 = pEVar4->pg;
                local_410 = (pEVar4->i).t;
                local_408 = (uint)pEVar4[1].pg;
                uStack_404 = (undefined4)((ulong)pEVar4[1].pg >> 0x20);
                local_400 = pEVar4[1].i.t;
                local_3f8 = pEVar4[2].pg;
                local_3f0 = pEVar4[2].i.t;
                local_3e8 = pEVar4[3].pg;
                local_3e0 = pEVar4[3].i.t;
                local_3d0 = 5;
                local_3d8 = (undefined1  [8])local_428;
                cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                          ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8)
                ;
              }
            }
            else {
              pEVar4 = (pvVar9->
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_418 = pEVar4->pg;
              local_410 = (pEVar4->i).t;
              local_408 = (uint)pEVar4[1].pg;
              uStack_404 = (undefined4)((ulong)pEVar4[1].pg >> 0x20);
              local_400 = pEVar4[1].i.t;
              local_3f8 = (ComputationGraph *)local_380._0_8_;
              local_3f0 = local_380._8_4_;
              local_3e8 = (ComputationGraph *)local_290._0_8_;
              local_3e0 = local_290._8_4_;
              local_3d0 = 5;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
          }
          else if (uVar21 + 1 < uVar11) {
            if (uVar21 + 2 < uVar11) {
              pEVar4 = (pvVar9->
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pEStack_420._0_4_ = *(undefined4 *)((long)pEVar4 + lVar20 + -0x18);
              local_428 = (undefined1  [8])*(undefined8 *)((long)&pEVar4[-2].pg + lVar20);
              local_418 = *(ComputationGraph **)((long)&pEVar4[-1].pg + lVar20);
              local_410 = *(uint *)((long)pEVar4 + lVar20 + -8);
              uVar16 = *(undefined8 *)((long)&pEVar4->pg + lVar20);
              local_408 = (uint)uVar16;
              uStack_404 = (undefined4)((ulong)uVar16 >> 0x20);
              local_400 = *(undefined4 *)((long)&(pEVar4->i).t + lVar20);
              local_3f8 = *(ComputationGraph **)((long)&pEVar4[1].pg + lVar20);
              local_3f0 = *(uint *)((long)&pEVar4[1].i.t + lVar20);
              local_3e8 = *(ComputationGraph **)((long)&pEVar4[2].pg + lVar20);
              local_3e0 = *(uint *)((long)&pEVar4[2].i.t + lVar20);
              local_3d0 = 5;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            else {
              pEVar4 = (pvVar9->
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pEStack_420._0_4_ = *(undefined4 *)((long)pEVar4 + lVar20 + -0x18);
              local_428 = (undefined1  [8])*(undefined8 *)((long)&pEVar4[-2].pg + lVar20);
              local_418 = *(ComputationGraph **)((long)&pEVar4[-1].pg + lVar20);
              local_410 = *(uint *)((long)pEVar4 + lVar20 + -8);
              uVar16 = *(undefined8 *)((long)&pEVar4->pg + lVar20);
              local_408 = (uint)uVar16;
              uStack_404 = (undefined4)((ulong)uVar16 >> 0x20);
              local_400 = *(undefined4 *)((long)&(pEVar4->i).t + lVar20);
              local_3f8 = *(ComputationGraph **)((long)&pEVar4[1].pg + lVar20);
              local_3f0 = *(uint *)((long)&pEVar4[1].i.t + lVar20);
              local_3e8 = (ComputationGraph *)local_380._0_8_;
              local_3e0 = local_380._8_4_;
              local_3d0 = 5;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
          }
          else {
            pEVar4 = (pvVar9->
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pEStack_420._0_4_ = *(undefined4 *)((long)pEVar4 + lVar20 + -0x18);
            local_428 = (undefined1  [8])*(undefined8 *)((long)&pEVar4[-2].pg + lVar20);
            local_418 = *(ComputationGraph **)((long)&pEVar4[-1].pg + lVar20);
            local_410 = *(uint *)((long)pEVar4 + lVar20 + -8);
            uVar16 = *(undefined8 *)((long)&pEVar4->pg + lVar20);
            local_408 = (uint)uVar16;
            uStack_404 = (undefined4)((ulong)uVar16 >> 0x20);
            local_400 = *(undefined4 *)((long)&(pEVar4->i).t + lVar20);
            local_3f8 = (ComputationGraph *)local_380._0_8_;
            local_3f0 = local_380._8_4_;
            local_3e8 = (ComputationGraph *)local_290._0_8_;
            local_3e0 = local_290._8_4_;
            local_3d0 = 5;
            local_3d8 = (undefined1  [8])local_428;
            cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                      ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
          }
          pEVar4 = local_2f8.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar23].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pEVar4->pg + lVar20) = local_3c8._0_8_;
          *(undefined4 *)((long)&(pEVar4->i).t + lVar20) = local_3c8._8_4_;
          local_418 = (ComputationGraph *)local_80._16_8_;
          local_410 = local_68;
          pEVar4 = local_2f8.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar23].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar16 = *(undefined8 *)((long)&pEVar4->pg + lVar20);
          local_408 = (uint)uVar16;
          uStack_404 = (undefined4)((ulong)uVar16 >> 0x20);
          local_400 = *(undefined4 *)((long)&(pEVar4->i).t + lVar20);
          local_2a0._M_len = 3;
          local_2a0._M_array = (iterator)local_428;
          cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3d8,&local_2a0);
          dVar25 = cnn::expr::tanh((expr *)local_3c8,dVar25);
          pEVar4 = local_180.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar23].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pEVar4->pg + lVar20) = local_3c8._0_8_;
          *(undefined4 *)((long)&(pEVar4->i).t + lVar20) = local_3c8._8_4_;
          pEStack_420._0_4_ = local_a8;
          local_428 = (undefined1  [8])local_c0._16_8_;
          local_418 = (ComputationGraph *)local_a0._16_8_;
          local_410 = local_88;
          pEVar4 = local_180.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar23].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar16 = *(undefined8 *)((long)&pEVar4->pg + lVar20);
          local_408 = (uint)uVar16;
          uStack_404 = (undefined4)((ulong)uVar16 >> 0x20);
          local_400 = *(uint *)((long)&(pEVar4->i).t + lVar20);
          local_3f8 = (ComputationGraph *)local_a0._0_8_;
          local_3f0 = local_a0._8_4_;
          local_3e8 = *(ComputationGraph **)
                       ((long)&(local_1c0.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start)->pg + (long)local_3a8);
          local_3e0 = *(uint *)((long)&((local_1c0.
                                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->i).t +
                               (long)local_3a8);
          local_2a0._M_len = 5;
          local_2a0._M_array = (iterator)local_428;
          cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3d8,&local_2a0);
          dVar25 = cnn::expr::tanh((expr *)local_3c8,dVar25);
          pEVar4 = local_108.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar23].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pEVar4->pg + lVar20) = local_3c8._0_8_;
          *(undefined4 *)((long)&(pEVar4->i).t + lVar20) = local_3c8._8_4_;
          cnn::expr::operator*
                    ((expr *)local_3c8,&local_60,
                     (Expression *)
                     ((long)&(local_108.
                              super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar23].
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start)->pg + lVar20));
          auVar26._0_8_ = cnn::expr::exp((expr *)local_428,dVar25);
          auVar26._8_56_ = extraout_var;
          pEVar4 = local_1d8.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar17].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined1 (*) [8])((long)&pEVar4->pg + lVar20) = local_428;
          *(uint *)((long)&(pEVar4->i).t + lVar20) = pEStack_420._0_4_;
          uVar21 = uVar21 + 1;
          pvVar9 = local_328.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17;
          lVar13 = (long)local_328.
                         super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar17].
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_328.
                         super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar17].
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = lVar13 >> 4;
          lVar20 = lVar20 + 0x10;
          pvVar15 = local_3a8;
        } while (uVar21 < uVar11);
      }
      cnn::expr::detail::
      f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                ((detail *)local_428,
                 local_1d8.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar23);
      *(undefined1 (*) [8])
       ((long)&(local_120.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + (long)pvVar15) = local_428;
      *(uint *)((long)&((local_120.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->i).t + (long)pvVar15) =
           pEStack_420._0_4_;
      local_3a8 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)(uVar23 * 0x18);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_198.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar17,
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      if (local_328.
          super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar23].
          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_328.
          super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar23].
          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar23 = 0;
        uVar11 = 1;
        do {
          pEVar4 = local_180.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar17].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          cnn::expr::cdiv((expr *)local_3c8,
                          local_1d8.
                          super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar17].
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar23,
                          (Expression *)
                          ((long)&(local_120.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->pg + (long)pvVar15));
          cnn::expr::cwise_multiply((expr *)local_428,pEVar4 + uVar23,(Expression *)local_3c8);
          pEVar4 = local_198.
                   super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar17].
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pEVar4[uVar23].pg = (ComputationGraph *)local_428;
          pEVar4[uVar23].i.t = pEStack_420._0_4_;
          bVar24 = uVar11 < (ulong)((long)local_328.
                                          super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_328.
                                          super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4);
          uVar23 = uVar11;
          uVar11 = (ulong)((int)uVar11 + 1);
        } while (bVar24);
      }
      cnn::expr::detail::
      f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                ((detail *)local_428,
                 (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 ((long)&(local_3a8->
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start +
                 (long)local_198.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start));
      pVVar22 = local_338;
      *(undefined1 (*) [8])
       ((long)&(local_138.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + (long)pvVar15) = local_428;
      *(uint *)((long)&((local_138.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->i).t + (long)pvVar15) =
           pEStack_420._0_4_;
      uVar17 = local_388 + 1;
    } while (uVar17 != local_398);
    lVar20 = local_398 << 4;
    lVar13 = 0;
    do {
      pEStack_420._0_4_ =
           *(undefined4 *)
            ((long)&((local_138.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar13);
      local_428 = (undefined1  [8])
                  *(undefined8 *)
                   ((long)&(local_138.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->pg + lVar13);
      local_418 = *(ComputationGraph **)
                   ((long)&(local_1c0.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->pg + lVar13);
      local_410 = *(uint *)((long)&((local_1c0.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar13);
      local_3d0 = 2;
      local_3d8 = (undefined1  [8])local_428;
      cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
      *(undefined8 *)
       ((long)&(local_2d0.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + lVar13) = local_3c8._0_8_;
      *(undefined4 *)
       ((long)&((local_2d0.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_start)->i).t + lVar13) = local_3c8._8_4_;
      lVar13 = lVar13 + 0x10;
    } while (lVar20 != lVar13);
    uVar17 = (ulong)pVVar22 & 0xffffffff;
    uVar23 = 2;
    lVar13 = 0;
    do {
      if (lVar13 == 0) {
        if ((uint)local_338 == 2) {
          pEStack_420._0_4_ = local_258;
          local_428 = (undefined1  [8])local_270._16_8_;
          local_418 = (ComputationGraph *)local_360._16_8_;
          local_410 = local_348;
          local_408 = (uint)(local_2d0.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start)->pg;
          uStack_404 = (undefined4)
                       ((ulong)(local_2d0.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start)->pg >> 0x20);
          local_400 = ((local_2d0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start)->i).t;
          local_3f8 = local_2d0.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].pg;
          local_3f0 = local_2d0.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].i.t;
          local_3e8 = (ComputationGraph *)local_360._0_8_;
          local_3e0 = local_360._8_4_;
          local_3d0 = 5;
          local_3d8 = (undefined1  [8])local_428;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
        }
        else if ((uint)local_338 == 1) {
          pEStack_420._0_4_ = local_258;
          local_428 = (undefined1  [8])local_270._16_8_;
          local_418 = (ComputationGraph *)local_360._16_8_;
          local_410 = local_348;
          local_408 = (uint)(local_2d0.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start)->pg;
          uStack_404 = (undefined4)
                       ((ulong)(local_2d0.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start)->pg >> 0x20);
          local_400 = ((local_2d0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start)->i).t;
          local_3f8 = (ComputationGraph *)local_360._0_8_;
          local_3f0 = local_360._8_4_;
          local_3e8 = (ComputationGraph *)local_270._0_8_;
          local_3e0 = local_270._8_4_;
          local_3d0 = 5;
          local_3d8 = (undefined1  [8])local_428;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
        }
        else {
          pEStack_420._0_4_ = local_258;
          local_428 = (undefined1  [8])local_270._16_8_;
          local_418 = (ComputationGraph *)local_360._16_8_;
          local_410 = local_348;
          local_408 = (uint)(local_2d0.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start)->pg;
          uStack_404 = (undefined4)
                       ((ulong)(local_2d0.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start)->pg >> 0x20);
          local_400 = ((local_2d0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start)->i).t;
          local_3f8 = local_2d0.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].pg;
          local_3f0 = local_2d0.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].i.t;
          local_3e8 = local_2d0.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].pg;
          local_3e0 = local_2d0.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].i.t;
          local_3d0 = 5;
          local_3d8 = (undefined1  [8])local_428;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
        }
      }
      else if (lVar13 == 0x10) {
        if (uVar23 - 1 < uVar17) {
          if ((uint)local_338 < 4) {
            pEStack_420._0_4_ = local_348;
            local_428 = (undefined1  [8])local_360._16_8_;
            local_418 = (local_2d0.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->pg;
            local_410 = ((local_2d0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start)->i).t;
            local_408 = (uint)local_2d0.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].pg;
            uStack_404 = (undefined4)
                         ((ulong)local_2d0.
                                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].pg >> 0x20);
            local_400 = local_2d0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].i.t;
            local_3f8 = local_2d0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].pg;
            local_3f0 = local_2d0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].i.t;
            local_3e8 = (ComputationGraph *)local_360._0_8_;
            local_3e0 = local_360._8_4_;
            local_3d0 = 5;
            local_3d8 = (undefined1  [8])local_428;
            cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                      ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
          }
          else {
            pEStack_420._0_4_ = local_348;
            local_428 = (undefined1  [8])local_360._16_8_;
            local_418 = (local_2d0.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->pg;
            local_410 = ((local_2d0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start)->i).t;
            local_408 = (uint)local_2d0.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].pg;
            uStack_404 = (undefined4)
                         ((ulong)local_2d0.
                                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].pg >> 0x20);
            local_400 = local_2d0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].i.t;
            local_3f8 = local_2d0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].pg;
            local_3f0 = local_2d0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].i.t;
            local_3e8 = local_2d0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[3].pg;
            local_3e0 = local_2d0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[3].i.t;
            local_3d0 = 5;
            local_3d8 = (undefined1  [8])local_428;
            cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                      ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
          }
        }
        else {
          pEStack_420._0_4_ = local_348;
          local_428 = (undefined1  [8])local_360._16_8_;
          local_418 = (local_2d0.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->pg;
          local_410 = ((local_2d0.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start)->i).t;
          local_408 = (uint)local_2d0.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].pg;
          uStack_404 = (undefined4)
                       ((ulong)local_2d0.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].pg >> 0x20);
          local_400 = local_2d0.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].i.t;
          local_3f8 = (ComputationGraph *)local_360._0_8_;
          local_3f0 = local_360._8_4_;
          local_3e8 = (ComputationGraph *)local_270._0_8_;
          local_3e0 = local_270._8_4_;
          local_3d0 = 5;
          local_3d8 = (undefined1  [8])local_428;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
        }
      }
      else if (uVar23 - 1 < uVar17) {
        if (uVar23 < uVar17) {
          pEStack_420._0_4_ =
               *(undefined4 *)
                ((long)local_2d0.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x18);
          local_428 = (undefined1  [8])
                      *(undefined8 *)
                       ((long)&local_2d0.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar13);
          local_418 = *(ComputationGraph **)
                       ((long)&local_2d0.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar13);
          local_410 = *(uint *)((long)local_2d0.
                                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8);
          uVar16 = *(undefined8 *)
                    ((long)&(local_2d0.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start)->pg + lVar13);
          local_408 = (uint)uVar16;
          uStack_404 = (undefined4)((ulong)uVar16 >> 0x20);
          local_400 = *(uint *)((long)&((local_2d0.
                                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar13);
          local_3f8 = *(ComputationGraph **)
                       ((long)&local_2d0.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].pg + lVar13);
          local_3f0 = *(uint *)((long)&local_2d0.
                                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].i.t + lVar13);
          local_3e8 = *(ComputationGraph **)
                       ((long)&local_2d0.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].pg + lVar13);
          local_3e0 = *(uint *)((long)&local_2d0.
                                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                       ._M_impl.super__Vector_impl_data._M_start[2].i.t + lVar13);
          local_3d0 = 5;
          local_3d8 = (undefined1  [8])local_428;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
        }
        else {
          pEStack_420._0_4_ =
               *(undefined4 *)
                ((long)local_2d0.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x18);
          local_428 = (undefined1  [8])
                      *(undefined8 *)
                       ((long)&local_2d0.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar13);
          local_418 = *(ComputationGraph **)
                       ((long)&local_2d0.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar13);
          local_410 = *(uint *)((long)local_2d0.
                                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8);
          uVar16 = *(undefined8 *)
                    ((long)&(local_2d0.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start)->pg + lVar13);
          local_408 = (uint)uVar16;
          uStack_404 = (undefined4)((ulong)uVar16 >> 0x20);
          local_400 = *(uint *)((long)&((local_2d0.
                                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar13);
          local_3f8 = *(ComputationGraph **)
                       ((long)&local_2d0.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].pg + lVar13);
          local_3f0 = *(uint *)((long)&local_2d0.
                                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].i.t + lVar13);
          local_3e8 = (ComputationGraph *)local_360._0_8_;
          local_3e0 = local_360._8_4_;
          local_3d0 = 5;
          local_3d8 = (undefined1  [8])local_428;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
        }
      }
      else {
        pEStack_420._0_4_ =
             *(undefined4 *)
              ((long)local_2d0.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x18);
        local_428 = (undefined1  [8])
                    *(undefined8 *)
                     ((long)&local_2d0.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar13);
        local_418 = *(ComputationGraph **)
                     ((long)&local_2d0.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar13);
        local_410 = *(uint *)((long)local_2d0.
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8);
        uVar16 = *(undefined8 *)
                  ((long)&(local_2d0.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start)->pg + lVar13);
        local_408 = (uint)uVar16;
        uStack_404 = (undefined4)((ulong)uVar16 >> 0x20);
        local_400 = *(uint *)((long)&((local_2d0.
                                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar13);
        local_3f8 = (ComputationGraph *)local_360._0_8_;
        local_3f0 = local_360._8_4_;
        local_3e8 = (ComputationGraph *)local_270._0_8_;
        local_3e0 = local_270._8_4_;
        local_3d0 = 5;
        local_3d8 = (undefined1  [8])local_428;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
      }
      x = local_1a8;
      pVVar22 = local_338;
      uVar11 = local_398;
      *(undefined8 *)
       ((long)&(local_310.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + lVar13) = local_3c8._0_8_;
      *(undefined4 *)
       ((long)&((local_310.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_start)->i).t + lVar13) = local_3c8._8_4_;
      lVar13 = lVar13 + 0x10;
      uVar23 = uVar23 + 1;
    } while (lVar20 != lVar13);
    lVar13 = 0;
    do {
      cnn::RNNBuilder::add_input((RNNBuilder *)local_428,(Expression *)local_390);
      *(undefined1 (*) [8])
       ((long)&(local_150.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + lVar13) = local_428;
      *(uint *)((long)&((local_150.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar13) =
           pEStack_420._0_4_;
      lVar13 = lVar13 + 0x10;
      pVVar18 = pVVar22;
    } while (lVar20 != lVar13);
    do {
      pVVar18 = (pointer)((long)&pVVar18[-1].t + 3);
      uVar17 = (ulong)pVVar18 & 0xffffffff;
      cnn::RNNBuilder::add_input((RNNBuilder *)local_428,x);
      local_168.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar17].pg = (ComputationGraph *)local_428;
      local_168.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar17].i.t = pEStack_420._0_4_;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    lVar13 = 0;
    do {
      pEStack_420._0_4_ =
           *(undefined4 *)
            ((long)&((local_150.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar13);
      local_428 = (undefined1  [8])
                  *(undefined8 *)
                   ((long)&(local_150.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->pg + lVar13);
      local_418 = *(ComputationGraph **)
                   ((long)&(local_168.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->pg + lVar13);
      local_410 = *(uint *)((long)&((local_168.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar13);
      local_3d0 = 2;
      local_3d8 = (undefined1  [8])local_428;
      EVar29 = cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                         ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
      pvVar15 = EVar29._8_8_;
      *(undefined8 *)
       ((long)&(local_250.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + lVar13) = local_3c8._0_8_;
      *(undefined4 *)
       ((long)&((local_250.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_start)->i).t + lVar13) = local_3c8._8_4_;
      lVar13 = lVar13 + 0x10;
    } while (lVar20 != lVar13);
    local_390 = (RNNBuilder *)(local_330 + 0x24);
    local_2b8 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)((ulong)pVVar22 & 0xffffffff);
    lVar13 = (long)local_2b8 << 4;
    local_3a8 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)0x0;
    do {
      this_01 = local_390;
      if (((ulong)local_330[0x24].cg & 0xfffffffd00000000) == 0) {
        *(undefined4 *)((long)&local_330[0x24].cg + 4) = 1;
      }
      (*local_390->_vptr_RNNBuilder[9])(local_390,cor,pvVar15);
      _local_428 = (Expression)(ZEXT816(0) << 0x40);
      auVar27 = ZEXT1664((undefined1  [16])_local_428);
      local_418 = (ComputationGraph *)0x0;
      cnn::RNNBuilder::start_new_sequence
                (this_01,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                         local_428);
      if (local_428 != (undefined1  [8])0x0) {
        operator_delete((void *)local_428);
      }
      if (in_stack_00000028 == '\0') {
        uStack_40c = 1;
        local_408 = 1;
        local_428._0_4_ = HIDDEN_DIM;
        cnn::expr::zeroes((expr *)local_3d8,(ComputationGraph *)cor,(Dim *)local_428);
        local_3b0 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)((ulong)local_3b0 & 0xffffffff00000000);
        do {
          if (6 < (int)local_3b0) break;
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
                    ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                     local_3c8,local_230,(allocator_type *)local_428);
          lVar20 = 0;
          do {
            dVar25 = auVar27._0_8_;
            cnn::expr::operator*
                      ((expr *)&local_50,(Expression *)local_c0,
                       (Expression *)
                       ((long)&(local_250.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start)->pg + lVar20));
            cnn::expr::operator*((expr *)&local_208,(Expression *)local_d0,(Expression *)local_3d8);
            cnn::expr::operator+((expr *)&local_40,&local_50,(Expression *)&local_208);
            auVar27._0_8_ = cnn::expr::tanh((expr *)&local_2a0,dVar25);
            auVar27._8_56_ = extraout_var_02;
            cnn::expr::operator*((expr *)local_428,(Expression *)local_e0,(Expression *)&local_2a0);
            dVar25 = auVar27._0_8_;
            *(undefined1 (*) [8])
             ((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)local_3c8._0_8_)->
                     super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar20) = local_428;
            *(uint *)((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)local_3c8._0_8_)
                             ->super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish + lVar20) = pEStack_420._0_4_
            ;
            lVar20 = lVar20 + 0x10;
          } while (lVar13 != lVar20);
          cnn::expr::detail::
          f<cnn::ConcatenateColumns,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                    ((detail *)&local_2a0,&local_250);
          cnn::expr::detail::
          f<cnn::Concatenate,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                    ((detail *)local_428,
                     (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                     local_3c8);
          cnn::expr::softmax((expr *)&local_40,(Expression *)local_428);
          cnn::expr::transpose((expr *)&local_208,&local_40);
          cnn::expr::transpose((expr *)&local_2b0,(Expression *)&local_2a0);
          cnn::expr::operator*((expr *)&local_50,(Expression *)&local_208,&local_2b0);
          cnn::expr::transpose((expr *)local_428,&local_50);
          local_418 = (ComputationGraph *)local_428;
          local_410 = pEStack_420._0_4_;
          pEStack_420._0_4_ =
               local_250.
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start[(long)local_3a8].i.t;
          local_428 = (undefined1  [8])
                      local_250.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)local_3a8].pg;
          local_208._M_len = 2;
          local_208._M_array = (iterator)local_428;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&local_50,&local_208);
          cnn::RNNBuilder::add_input((RNNBuilder *)local_428,(Expression *)local_390);
          EVar29 = _local_428;
          local_3d8 = local_428;
          local_400 = pEStack_420._0_4_;
          local_3d0 = CONCAT44(local_3d0._4_4_,pEStack_420._0_4_);
          pEStack_420._0_4_ = local_1f8._8_4_;
          local_428 = (undefined1  [8])local_1f8._0_8_;
          local_418 = (ComputationGraph *)local_1f8._16_8_;
          local_410 = local_1e0;
          local_408 = (uint)EVar29.pg;
          uStack_404 = EVar29.pg._4_4_;
          local_2e0._M_len = 3;
          local_2e0._M_array = (iterator)local_428;
          cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&local_2b0,&local_2e0);
          auVar27._0_8_ = cnn::expr::tanh((expr *)&local_208,dVar25);
          auVar27._8_56_ = extraout_var_03;
          cnn::expr::operator*((expr *)&local_2b0,(Expression *)local_f0,(Expression *)&local_208);
          if (predict == (uint *)0x0) {
            bVar24 = true;
          }
          else {
            pTVar10 = cnn::ComputationGraph::incremental_forward((ComputationGraph *)cor);
            cnn::as_vector((vector<float,_std::allocator<float>_> *)local_428,pTVar10);
            pvVar15 = local_3a8;
            local_39c = -1;
            if ((long)pEStack_420 - (long)local_428 != 0) {
              lVar20 = (long)pEStack_420 - (long)local_428 >> 2;
              lVar14 = 0;
              auVar27 = ZEXT1664(ZEXT816(0xd4b075823b6c498a));
              do {
                dVar25 = (double)*(float *)((long)&(((
                                                  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                                  *)local_428)->
                                                  super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                           lVar14 * 4);
                if (auVar27._0_8_ < dVar25) {
                  local_39c = (int)lVar14;
                  auVar27 = ZEXT1664(CONCAT88(in_XMM2_Qb,dVar25));
                }
                lVar14 = lVar14 + 1;
              } while (lVar20 + (ulong)(lVar20 == 0) != lVar14);
            }
            this_00 = (vector<int,std::allocator<int>> *)
                      ((local_238->nodes).
                       super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                       super__Vector_impl_data._M_start + (long)local_3a8 * 3);
            __position._M_current = *(int **)(this_00 + 8);
            if (__position._M_current == *(int **)(this_00 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (this_00,__position,&local_39c);
            }
            else {
              *__position._M_current = local_39c;
              *(int **)(this_00 + 8) = __position._M_current + 1;
            }
            pvVar2 = (local_340->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + (long)pvVar15;
            uVar17 = (ulong)(int)local_3b0;
            lVar20 = *(long *)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data;
            uVar23 = (long)(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish - lVar20 >> 2;
            if (uVar17 < uVar23) {
              if (*(int *)(lVar20 + uVar17 * 4) == local_39c) {
                auVar27 = ZEXT864((ulong)(*(double *)predict + 1.0));
                *(double *)predict = *(double *)predict + 1.0;
              }
              if (uVar23 <= uVar17) goto LAB_0016307c;
              cnn::expr::pickneglogsoftmax
                        ((expr *)&local_2e0,&local_2b0,
                         *(uint *)(*(long *)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)
                                             ._M_impl.super__Vector_impl_data + uVar17 * 4));
              std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
              emplace_back<cnn::expr::Expression>
                        ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                         local_228,(Expression *)&local_2e0);
            }
            else {
LAB_0016307c:
              cnn::expr::pickneglogsoftmax
                        ((expr *)&local_2e0,&local_2b0,
                         (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish[-1]);
              std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
              emplace_back<cnn::expr::Expression>
                        ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                         local_228,(Expression *)&local_2e0);
            }
            bVar24 = local_39c != endlabel;
            if (local_428 != (undefined1  [8])0x0) {
              operator_delete((void *)local_428);
            }
            local_3b0 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)CONCAT44(local_3b0._4_4_,(int)local_3b0 + 1);
          }
          if ((ComputationGraph *)local_3c8._0_8_ != (ComputationGraph *)0x0) {
            operator_delete((void *)local_3c8._0_8_);
          }
        } while (bVar24);
        if (overall != (uint *)0x0) {
          *overall = *overall + (int)local_3b0;
        }
        piVar7 = (int *)CONCAT71(in_stack_00000021,train);
        pvVar15 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)local_428;
        if (piVar7 != (int *)0x0) {
          pvVar2 = (local_340->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pvVar15 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)((ulong)((long)pvVar2[(long)local_3a8].
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               *(long *)&pvVar2[(long)local_3a8].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data) >> 2);
          *piVar7 = *piVar7 + (int)pvVar15;
        }
      }
      else {
        uStack_40c = 1;
        local_408 = 1;
        local_428._0_4_ = HIDDEN_DIM;
        cnn::expr::zeroes((expr *)local_3d8,(ComputationGraph *)cor,(Dim *)local_428);
        pvVar2 = (local_340->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_3b0 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)((long)local_3a8 * 3);
        if (pvVar2[(long)local_3a8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            pvVar2[(long)local_3a8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar17 = 0;
          local_398 = (ulong)local_398._4_4_ << 0x20;
        }
        else {
          local_388 = 0;
          local_398 = (ulong)local_398._4_4_ << 0x20;
          do {
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
                      ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                       local_3c8,local_230,(allocator_type *)local_428);
            lVar20 = 0;
            do {
              dVar25 = auVar27._0_8_;
              cnn::expr::operator*
                        ((expr *)&local_50,(Expression *)local_c0,
                         (Expression *)
                         ((long)&(local_250.
                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->pg + lVar20));
              cnn::expr::operator*
                        ((expr *)&local_208,(Expression *)local_d0,(Expression *)local_3d8);
              cnn::expr::operator+((expr *)&local_40,&local_50,(Expression *)&local_208);
              auVar27._0_8_ = cnn::expr::tanh((expr *)&local_2a0,dVar25);
              auVar27._8_56_ = extraout_var_00;
              cnn::expr::operator*
                        ((expr *)local_428,(Expression *)local_e0,(Expression *)&local_2a0);
              dVar25 = auVar27._0_8_;
              *(undefined1 (*) [8])
               ((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)local_3c8._0_8_)->
                       super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar20) = local_428;
              *(uint *)((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)
                                local_3c8._0_8_)->
                               super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish + lVar20) =
                   pEStack_420._0_4_;
              lVar20 = lVar20 + 0x10;
            } while (lVar13 != lVar20);
            cnn::expr::detail::
            f<cnn::ConcatenateColumns,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                      ((detail *)&local_2a0,&local_250);
            cnn::expr::detail::
            f<cnn::Concatenate,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                      ((detail *)local_428,
                       (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                       local_3c8);
            cnn::expr::softmax((expr *)&local_40,(Expression *)local_428);
            cnn::expr::transpose((expr *)&local_208,&local_40);
            cnn::expr::transpose((expr *)&local_2b0,(Expression *)&local_2a0);
            cnn::expr::operator*((expr *)&local_50,(Expression *)&local_208,&local_2b0);
            cnn::expr::transpose((expr *)local_428,&local_50);
            local_418 = (ComputationGraph *)local_428;
            local_410 = pEStack_420._0_4_;
            pEStack_420._0_4_ =
                 local_250.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_start[(long)local_3a8].i.t;
            local_428 = (undefined1  [8])
                        local_250.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)local_3a8].pg;
            local_208._M_len = 2;
            local_208._M_array = (iterator)local_428;
            cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                      ((detail *)&local_50,&local_208);
            cnn::RNNBuilder::add_input((RNNBuilder *)local_428,(Expression *)local_390);
            EVar29 = _local_428;
            local_3d8 = local_428;
            local_400 = pEStack_420._0_4_;
            local_3d0 = CONCAT44(local_3d0._4_4_,pEStack_420._0_4_);
            pEStack_420._0_4_ = local_1f8._8_4_;
            local_428 = (undefined1  [8])local_1f8._0_8_;
            local_418 = (ComputationGraph *)local_1f8._16_8_;
            local_410 = local_1e0;
            local_408 = (uint)EVar29.pg;
            uStack_404 = EVar29.pg._4_4_;
            local_2e0._M_len = 3;
            local_2e0._M_array = (iterator)local_428;
            cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                      ((detail *)&local_2b0,&local_2e0);
            auVar27._0_8_ = cnn::expr::tanh((expr *)&local_208,dVar25);
            auVar27._8_56_ = extraout_var_01;
            cnn::expr::operator*((expr *)&local_2b0,(Expression *)local_f0,(Expression *)&local_208)
            ;
            if (predict != (uint *)0x0) {
              pTVar10 = cnn::ComputationGraph::incremental_forward((ComputationGraph *)cor);
              cnn::as_vector((vector<float,_std::allocator<float>_> *)local_428,pTVar10);
              if ((long)pEStack_420 - (long)local_428 == 0) {
                iVar12 = -1;
              }
              else {
                lVar20 = (long)pEStack_420 - (long)local_428 >> 2;
                uVar17 = 0xffffffff;
                uVar23 = 0;
                auVar27 = ZEXT1664(ZEXT816(0xd4b075823b6c498a));
                do {
                  auVar28._0_8_ =
                       (double)*(float *)((long)&(((
                                                  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                                  *)local_428)->
                                                 super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                                 )._M_impl.super__Vector_impl_data._M_start +
                                         uVar23 * 4);
                  auVar28._8_8_ = in_XMM2_Qb;
                  dVar25 = auVar27._0_8_;
                  auVar6 = vmaxsd_avx(auVar28,auVar27._0_16_);
                  auVar27 = ZEXT1664(auVar6);
                  if (dVar25 < auVar28._0_8_) {
                    uVar17 = uVar23 & 0xffffffff;
                  }
                  iVar12 = (int)uVar17;
                  uVar23 = uVar23 + 1;
                } while (lVar20 + (ulong)(lVar20 == 0) != uVar23);
              }
              pvVar2 = (local_340->
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if ((&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start)[(long)local_3b0][local_388] == iVar12) {
                auVar27 = ZEXT864((ulong)(*(double *)predict + 1.0));
                *(double *)predict = *(double *)predict + 1.0;
              }
              cnn::expr::pickneglogsoftmax
                        ((expr *)&local_2e0,&local_2b0,
                         (&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start)[(long)local_3b0][local_388]);
              std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
              emplace_back<cnn::expr::Expression>
                        ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                         local_228,(Expression *)&local_2e0);
              if (local_428 != (undefined1  [8])0x0) {
                operator_delete((void *)local_428);
              }
              local_398 = CONCAT44(local_398._4_4_,(int)local_398 + 1);
            }
            if ((ComputationGraph *)local_3c8._0_8_ != (ComputationGraph *)0x0) {
              operator_delete((void *)local_3c8._0_8_);
            }
            local_388 = (ulong)(int)local_398;
            pvVar2 = (local_340->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar17 = (long)(&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish)[(long)local_3b0] -
                     (long)(&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start)[(long)local_3b0] >> 2;
          } while (local_388 < uVar17);
        }
        pvVar15 = local_3b0;
        if (overall != (uint *)0x0) {
          pvVar15 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)(local_398 & 0xffffffff);
          *overall = *overall + (int)local_398;
        }
        piVar7 = (int *)CONCAT71(in_stack_00000021,train);
        if (piVar7 != (int *)0x0) {
          *piVar7 = *piVar7 + (int)uVar17;
        }
      }
      local_3a8 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)((long)&(local_3a8->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
    } while (local_3a8 != local_2b8);
  }
  pRVar8 = local_1a0;
  cnn::expr::detail::
  f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            ((detail *)local_1a0,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_228);
  if ((pointer)local_228._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_228._0_8_);
  }
  if (local_250.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_168.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_150.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_310.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_310.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2d0.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d0.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_198);
  if (local_120.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_1d8);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_108);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_180);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_2f8);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_328);
  uVar16 = extraout_RDX;
  if (local_1c0.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    uVar16 = extraout_RDX_00;
  }
  EVar29._8_8_ = uVar16;
  EVar29.pg = (ComputationGraph *)pRVar8;
  return EVar29;
}

Assistant:

Expression BuildTaggingGraph(const vector<int>& sent, const vector< vector<int> >& chars, const vector< vector<int> >& labels,  vector< vector<int> >& results, ComputationGraph& cg, double* cor = 0, unsigned* predict = 0, unsigned* overall = 0, bool train=true) {
    const unsigned slen = sent.size();
    l2rbuilder.new_graph(cg);  // reset RNN builder for new graph
    l2rbuilder.start_new_sequence();
    r2lbuilder.new_graph(cg);  // reset RNN builder for new graph
    r2lbuilder.start_new_sequence();
    results.resize(slen);

    Expression i_wordpadding_2 = parameter(cg, p_wordpadding_2);
    Expression i_wordpadding_1 = parameter(cg, p_wordpadding_1);
    Expression i_wordpadding2 = parameter(cg, p_wordpadding2);
    Expression i_wordpadding1 = parameter(cg, p_wordpadding1);

    Expression i_charpadding_2 = parameter(cg, p_charpadding_2);
    Expression i_charpadding_1 = parameter(cg, p_charpadding_1);
    Expression i_charpadding2 = parameter(cg, p_charpadding2);
    Expression i_charpadding1 = parameter(cg, p_charpadding1);
  
    Expression i_charw2charh = parameter(cg, p_charw2charh);
    Expression i_charhbias = parameter(cg, p_charhbias);
    //attention pooling
    Expression i_charh2xMExp = parameter(cg, p_charh2xMExp);
    Expression i_word2xMExp = parameter(cg, p_word2xMExp);
    Expression i_xMExpbias = parameter(cg, p_xMExpbias);
    Expression i_xMExp2xExp = parameter(cg, p_xMExp2xExp);
    //
    
    // Expression i_l2oh = parameter(cg, p_l2oh);
    // Expression i_r2oh = parameter(cg, p_r2oh);
    // Expression i_ohbias = parameter(cg, p_ohbias);

    //attention labeling
    Expression i_oh2ohxMExp = parameter(cg, p_oh2ohxMExp);
    Expression oh2ohxMExp = parameter(cg, p_osh2ohxMExp);
    Expression i_u = parameter(cg, p_u);

    Expression i_oh2lh = parameter(cg, p_oh2lh);
    Expression i_lhbias = parameter(cg, p_lhbias);

    Expression i_lh2l = parameter(cg, p_lh2l);

    vector<Expression> i_word(slen);

    vector< vector<Expression> > i_char(slen);
    vector< vector<Expression> > i_charw(slen);
    vector< vector<Expression> > i_charh(slen);
    //attention pooling
    vector< vector<Expression> > i_charxMExp(slen);
    vector< vector<Expression> > i_charxExp(slen);
    vector< Expression > i_charSum(slen);
    vector< vector<Expression> > i_charPool(slen);
    vector< Expression > i_charinput(slen);
    //

    vector< Expression > i_input(slen);
    vector< Expression > i_inputw(slen);

    vector<Expression> fwds(slen);
    vector<Expression> revs(slen);
    vector<Expression> i_oh(slen);

    vector<Expression> errs; 
    for (unsigned i = 0; i < slen; ++i) {
      i_word[i] = lookup(cg, p_w, sent[i]);
      if (!eval) { i_word[i] = dropout(i_word[i], pdrop); }
      i_char[i].resize(chars[i].size());
      for (unsigned j = 0; j < chars[i].size(); ++j) {
        i_char[i][j] = lookup(cg, p_c, chars[i][j]);
        if (!eval) { i_char[i][j] = dropout(i_char[i][j], pdrop); }
      }
//      cerr<<"lookup done"<<endl;
      i_charw[i].resize(i_char[i].size());
      i_charh[i].resize(i_char[i].size());
      i_charxMExp[i].resize(i_char[i].size());
      i_charxExp[i].resize(i_char[i].size());
      for (int j = 0; j < i_char[i].size(); ++j) {
        if ( j-1 < 0){
	  if ( j+1 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_charpadding1, i_charpadding2});
	  else if ( j+2 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_char[i][j+1], i_charpadding1});
	  else
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
  	}
	else if ( j-2 < 0){
	  if ( j+1 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_charpadding1, i_charpadding2});
    	  else if ( j+2 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_charpadding1});
	  else
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
        }
  	else{
	  if ( j+1 >= i_char[i].size())
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_charpadding1, i_charpadding2});
          else if ( j+2 >= i_char[i].size())
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_charpadding1});
          else 
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
	}
	i_charh[i][j] = tanh(affine_transform({i_charhbias, i_charw2charh ,i_charw[i][j]}));
	i_charxMExp[i][j] = tanh(affine_transform({i_xMExpbias, i_charh2xMExp, i_charh[i][j], i_word2xMExp, i_word[i]}));
	i_charxExp[i][j] = exp(i_xMExp2xExp * i_charxMExp[i][j]);
      }
      i_charSum[i] = sum(i_charxExp[i]);
      i_charPool[i].resize(i_char[i].size());
      for (unsigned j = 0; j < i_char[i].size(); ++j){
        i_charPool[i][j] = cwise_multiply(i_charh[i][j], cdiv(i_charxExp[i][j], i_charSum[i]));
      }
      i_charinput[i] = sum(i_charPool[i]);
    }
//    cerr<<"input done"<<endl;
    for (unsigned i = 0; i < slen; ++i) {
      i_input[i] = concatenate({i_charinput[i], i_word[i]});
    }
//    cerr<<"concatenate done"<<endl;
    for (int i = 0; i < slen; ++i) {
      if(i-1 < 0){
        if(i+1>= slen){
	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_wordpadding1, i_wordpadding2});
	}
   	else if(i+2>=slen){
	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_input[i+1], i_wordpadding1});
	}
 	else{
 	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_input[i+1], i_input[i+2]});
	}
      }
      else if(i-2<0){
        if(i+1>= slen){
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_wordpadding1, i_wordpadding2});
        }
        else if(i+2>=slen){
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_input[i+1], i_wordpadding1});
        }
        else{
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_input[i+1], i_input[i+2]});
        }
      }
      else{
        if(i+1>= slen){
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_wordpadding1, i_wordpadding2});
        }
        else if(i+2>=slen){
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_input[i+1], i_wordpadding1});
        }
        else{
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_input[i+1], i_input[i+2]});
        }
      }
    }
//    cerr<<"intput windows done "<<INPUT_WINDOWS_DIM<<endl;
    for (unsigned i = 0; i < slen; ++i)
      fwds[i] = l2rbuilder.add_input(i_inputw[i]);
    for (unsigned i = 0; i < slen; ++i)
      revs[slen - i - 1] = r2lbuilder.add_input(i_inputw[slen - i - 1]);   
//    cerr<<"lstm done"<<endl;
    for (unsigned i = 0; i < slen; ++i)
      //i_oh[i] = tanh(affine_transform({i_ohbias, i_l2oh, fwds[i], i_r2oh, revs[i]}));
        i_oh[i] = concatenate({fwds[i], revs[i]});

    for (unsigned i = 0; i < slen; ++i) {
   //   cerr<<i<<endl;
      orderbuilder.new_graph(cg);
      orderbuilder.start_new_sequence();
      if(train) {
	int j = 0;

	Expression oh = zeroes(cg, {HIDDEN_DIM});

	while(j < labels[i].size()){
	  //attention
	  Expression i_att_oh;
      	  vector<Expression> alpha_i(slen);
	  for (unsigned att = 0; att < slen; ++att){
	    alpha_i[att] = i_u * tanh(i_oh2ohxMExp * i_oh[att] + oh2ohxMExp * oh);
   	  }

  	  Expression input_cols = concatenate_cols(i_oh);
	  Expression alpha = softmax(concatenate(alpha_i));
    	  i_att_oh = transpose( transpose(alpha) * transpose( input_cols ) );
	  
	  Expression combine_h = concatenate({i_oh[i], i_att_oh});
	  oh = orderbuilder.add_input(combine_h);

          Expression i_lh = tanh(affine_transform({i_lhbias, i_oh2lh, oh}));
          Expression i_l = i_lh2l * i_lh;
	  
	  if (cor) {
	    vector<float> dist = as_vector(cg.incremental_forward());
	    double best = -9e99;
	    int bestk = -1;
            for (int k = 0; k < dist.size(); ++k) {
              if(dist[k] > best) {best = dist[k]; bestk = k; }
            }
            if (labels[i][j] == bestk) (*cor)++;
	    errs.push_back(pickneglogsoftmax(i_l, labels[i][j]));
            j += 1;
	  } 
	}
        if(predict) (*predict) += j;
        if(overall) (*overall) += labels[i].size();
      }
      else{
	int j = 0;
	
	Expression oh = zeroes(cg, {HIDDEN_DIM});

        while(j < 7) {
	  //attention
	  Expression i_att_oh;
          vector<Expression> alpha_i(slen);
          for (unsigned att = 0; att < slen; ++att){
            alpha_i[att] = i_u * tanh(i_oh2ohxMExp * i_oh[att] + oh2ohxMExp * oh);
          }

          Expression input_cols = concatenate_cols(i_oh);
          Expression alpha = softmax(concatenate(alpha_i));
          i_att_oh = transpose( transpose(alpha) * transpose( input_cols ) );

          Expression combine_h = concatenate({i_oh[i], i_att_oh});
          oh = orderbuilder.add_input(combine_h);

          Expression i_lh = tanh(affine_transform({i_lhbias, i_oh2lh, oh}));
          Expression i_l = i_lh2l * i_lh;
	  if (cor) {
	    vector<float> dist = as_vector(cg.incremental_forward());
	    double best = -9e99;
	    int bestk = -1;
	    for (int k = 0; k < dist.size(); ++k) {
	      if(dist[k] > best) {best = dist[k]; bestk = k; }
   	    }
		results[i].push_back(bestk);
	    if (j < labels[i].size() && labels[i][j] == bestk) (*cor)++;
	  
	    if (j < labels[i].size()) errs.push_back(pickneglogsoftmax(i_l, labels[i][j]));
	    else errs.push_back(pickneglogsoftmax(i_l, labels[i][labels[i].size()-1]));
	    j += 1;
	    if(bestk == endlabel) break;
	  }
       }
       if(predict) (*predict) += j;
       if(overall) (*overall) += labels[i].size();
     }
    }
//    cerr<<"errs done"<<endl;
    return sum(errs);
  }